

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommodoreGCR.cpp
# Opt level: O3

void Storage::Encodings::CommodoreGCR::encode_block(uint8_t *destination,uint8_t *source)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  
  bVar1 = *source;
  uVar2 = encoding_for_nibble(bVar1);
  uVar3 = encoding_for_nibble(bVar1 >> 4);
  bVar1 = source[1];
  uVar4 = encoding_for_nibble(bVar1);
  uVar5 = encoding_for_nibble(bVar1 >> 4);
  bVar1 = source[2];
  uVar6 = encoding_for_nibble(bVar1);
  uVar7 = encoding_for_nibble(bVar1 >> 4);
  bVar1 = source[3];
  uVar8 = encoding_for_nibble(bVar1);
  uVar9 = encoding_for_nibble(bVar1 >> 4);
  *destination = (uint8_t)((uVar3 << 5 | uVar2) >> 2);
  destination[1] = (byte)((uVar5 << 5 | uVar4) >> 4) | (byte)(uVar2 << 6);
  destination[2] = (byte)(uVar7 >> 1) | (byte)(uVar4 << 4);
  destination[3] = (byte)(uVar9 >> 3) | (char)(uVar7 << 7) + (char)uVar6 * '\x04';
  destination[4] = (byte)(uVar9 << 5) | (byte)uVar8;
  return;
}

Assistant:

void Storage::Encodings::CommodoreGCR::encode_block(uint8_t *destination, uint8_t *source) {
	unsigned int encoded_bytes[4] = {
		encoding_for_byte(source[0]),
		encoding_for_byte(source[1]),
		encoding_for_byte(source[2]),
		encoding_for_byte(source[3]),
	};

	destination[0] = uint8_t(encoded_bytes[0] >> 2);
	destination[1] = uint8_t((encoded_bytes[0] << 6) | (encoded_bytes[1] >> 4));
	destination[2] = uint8_t((encoded_bytes[1] << 4) | (encoded_bytes[2] >> 6));
	destination[3] = uint8_t((encoded_bytes[2] << 2) | (encoded_bytes[3] >> 8));
	destination[4] = uint8_t(encoded_bytes[3]);
}